

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

NormalizerSpec * __thiscall
sentencepiece::SentencePieceTrainer::GetNormalizerSpec
          (NormalizerSpec *__return_storage_ptr__,SentencePieceTrainer *this,string_view name)

{
  string *output;
  undefined8 *puVar1;
  char *pcVar2;
  ostream *poVar3;
  string_view name_00;
  Die local_41;
  Status _status;
  string local_38;
  
  NormalizerSpec::NormalizerSpec(__return_storage_ptr__);
  NormalizerSpec::set_name(__return_storage_ptr__,(char *)name._M_len,(size_t)this);
  puVar1 = (undefined8 *)
           ((ulong)(__return_storage_ptr__->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  output = (string *)*puVar1;
  pcVar2 = (char *)puVar1[1];
  NormalizerSpec::_internal_mutable_precompiled_charsmap_abi_cxx11_(__return_storage_ptr__);
  name_00._M_str = pcVar2;
  name_00._M_len = (size_t)&_status;
  normalizer::Builder::GetPrecompiledCharsMap(name_00,output);
  if (_status.rep_._M_t.
      super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
      ._M_t.
      super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
      .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl !=
      (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
       )0x0) {
    local_41.die_ = true;
    pcVar2 = logging::BaseName("third_party/sentencepiece/src/sentencepiece_trainer.cc");
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x60);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"_status.ok()");
    poVar3 = std::operator<<(poVar3,"] ");
    util::Status::ToString_abi_cxx11_(&local_38,&_status);
    std::operator<<(poVar3,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    error::Die::~Die(&local_41);
  }
  util::Status::~Status(&_status);
  return __return_storage_ptr__;
}

Assistant:

NormalizerSpec SentencePieceTrainer::GetNormalizerSpec(absl::string_view name) {
  NormalizerSpec spec;
  spec.set_name(name.data(), name.size());
  CHECK_OK(normalizer::Builder::GetPrecompiledCharsMap(
      spec.name(), spec.mutable_precompiled_charsmap()));
  return spec;
}